

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MinutesOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  date_t *pdVar7;
  long *plVar8;
  bool bVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  idx_t idx_in_entry_1;
  idx_t idx_in_entry;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  idx_t local_78;
  ValidityMask *local_70;
  date_t *local_68;
  idx_t local_60;
  long *local_58;
  ulong local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ulong local_40;
  long *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_70 = mask;
  local_68 = ldata;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar11 = 0;
      do {
        bVar9 = Value::IsFinite<duckdb::date_t>((date_t)local_68[uVar11].days);
        if (!bVar9) {
          if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_78 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_88,&local_78);
            p_Var6 = p_Stack_80;
            peVar5 = local_88;
            local_88 = (element_type *)0x0;
            p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar4 = (byte)uVar11 & 0x3f;
          puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar11 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        result_data[uVar11] = 0;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_78 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long **)mask,&local_78);
      p_Var6 = p_Stack_80;
      peVar5 = local_88;
      local_88 = (element_type *)0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar5;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar10->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_50 = count + 0x3f >> 6;
      local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_40 = 0;
      uVar11 = 0;
      local_60 = count;
      local_58 = result_data;
      do {
        plVar8 = local_58;
        pdVar7 = local_68;
        puVar2 = (local_70->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar2[local_40];
        }
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar14 = uVar13;
        if (uVar12 != 0) {
          uVar14 = uVar11;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              do {
                bVar9 = Value::IsFinite<duckdb::date_t>((date_t)pdVar7[uVar11].days);
                if (!bVar9) {
                  if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_78 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_88,&local_78);
                    p_Var6 = p_Stack_80;
                    peVar5 = local_88;
                    local_88 = (element_type *)0x0;
                    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data
                             .internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar5;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var6;
                    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    }
                    if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
                    }
                    pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_48);
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar10->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  bVar4 = (byte)uVar11 & 0x3f;
                  puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar11 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                }
                plVar8[uVar11] = 0;
                uVar11 = uVar11 + 1;
                uVar14 = uVar11;
              } while (uVar13 != uVar11);
            }
          }
          else {
            count = local_60;
            if (uVar11 < uVar13) {
              local_38 = local_58 + uVar11;
              uVar14 = 0;
              do {
                if ((uVar12 >> (uVar14 & 0x3f) & 1) != 0) {
                  bVar9 = Value::IsFinite<duckdb::date_t>((date_t)pdVar7[uVar11 + uVar14].days);
                  if (!bVar9) {
                    if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                        (unsigned_long *)0x0) {
                      local_78 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_88,&local_78);
                      p_Var6 = p_Stack_80;
                      peVar5 = local_88;
                      local_88 = (element_type *)0x0;
                      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = peVar5;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = p_Var6;
                      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                      }
                      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
                      }
                      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(local_48);
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                           (unsigned_long *)
                           (pTVar10->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar4 = (byte)(uVar14 + uVar11) & 0x3f;
                    puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
                             + (uVar14 + uVar11 >> 6);
                    *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                  }
                  local_38[uVar14] = 0;
                }
                uVar14 = uVar14 + 1;
              } while ((uVar11 - uVar13) + uVar14 != 0);
              count = local_60;
              uVar14 = uVar11 + uVar14;
            }
          }
        }
        local_40 = local_40 + 1;
        uVar11 = uVar14;
      } while (local_40 != local_50);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}